

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

ssize_t __thiscall DataStream::read(DataStream *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  ulong uVar2;
  pointer pbVar3;
  pointer pbVar4;
  char *pcVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (__buf != (void *)0x0) {
    uVar2 = this->m_read_pos;
    uVar6 = uVar2 + (long)__buf;
    if ((CARRY8(uVar2,(ulong)__buf)) ||
       (pbVar3 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_start,
       (ulong)((long)(this->vch).
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pbVar3) < uVar6)) {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      std::iostream_category();
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"DataStream::read(): end of data");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_001ba93c;
    }
    memcpy((void *)CONCAT44(in_register_00000034,__fd),pbVar3 + uVar2,(size_t)__buf);
    pbVar3 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (uVar6 == (long)pbVar4 - (long)pbVar3) {
      this->m_read_pos = 0;
      if (pbVar4 != pbVar3) {
        (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = pbVar3;
      }
    }
    else {
      this->m_read_pos = uVar6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
LAB_001ba93c:
  __stack_chk_fail();
}

Assistant:

void read(Span<value_type> dst)
    {
        if (dst.size() == 0) return;

        // Read from the beginning of the buffer
        auto next_read_pos{CheckedAdd(m_read_pos, dst.size())};
        if (!next_read_pos.has_value() || next_read_pos.value() > vch.size()) {
            throw std::ios_base::failure("DataStream::read(): end of data");
        }
        memcpy(dst.data(), &vch[m_read_pos], dst.size());
        if (next_read_pos.value() == vch.size()) {
            m_read_pos = 0;
            vch.clear();
            return;
        }
        m_read_pos = next_read_pos.value();
    }